

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

string_view
google::protobuf::internal::TransparentSupport<std::__cxx11::string>::
ImplicitConvert<char_const*const&>(char **str)

{
  char *__s;
  string_view sVar1;
  
  __s = *str;
  sVar1._M_len = strlen(__s);
  sVar1._M_str = __s;
  return sVar1;
}

Assistant:

static absl::string_view ImplicitConvert(T&& str) {
    if constexpr (std::is_convertible<T, absl::string_view>::value) {
      absl::string_view res = str;
      return res;
    } else if constexpr (std::is_convertible<T, const std::string&>::value) {
      const std::string& ref = str;
      return ref;
    } else {
      return {str.data(), str.size()};
    }
  }